

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O0

span<slang::SourceLocation,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<slang::SourceLocation,_18446744073709551615UL>::subspan
          (span<slang::SourceLocation,_18446744073709551615UL> *this,size_type offset,
          size_type count)

{
  bool bVar1;
  size_type sVar2;
  pointer pSVar3;
  size_type local_58;
  size_type count_local;
  size_type offset_local;
  span<slang::SourceLocation,_18446744073709551615UL> *this_local;
  
  bVar1 = span_lite::detail::is_positive<unsigned_long>(offset);
  if (((bVar1) && (sVar2 = size(this), offset <= sVar2)) &&
     ((count == 0xffffffffffffffff ||
      ((bVar1 = span_lite::detail::is_positive<unsigned_long>(count), bVar1 &&
       (sVar2 = size(this), offset + count <= sVar2)))))) {
    pSVar3 = data(this);
    local_58 = count;
    if (count == 0xffffffffffffffff) {
      local_58 = size(this);
      local_58 = local_58 - offset;
    }
    span<slang::SourceLocation,18446744073709551615ul>::span<slang::SourceLocation*>
              ((span<slang::SourceLocation,18446744073709551615ul> *)&this_local,pSVar3 + offset,
               local_58);
    return _this_local;
  }
  span_lite::detail::report_contract_violation
            (
            "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../external/span.hpp:1128: Precondition violation."
            );
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    subspan( size_type offset, size_type count = static_cast<size_type>(dynamic_extent) ) const
    {
        span_EXPECTS(
            ( ( detail::is_positive( offset ) && offset <= size() ) ) &&
            ( count == static_cast<size_type>(dynamic_extent) || ( detail::is_positive( count ) && offset + count <= size() ) )
        );

        return span< element_type, dynamic_extent >(
            data() + offset, count == static_cast<size_type>(dynamic_extent) ? size() - offset : count );
    }